

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O0

bool_t xdr_uint16_t(XDR *__xdrs,uint16_t *__up)

{
  xdr_op xVar1;
  undefined7 extraout_var;
  ulong uVar2;
  undefined7 extraout_var_00;
  uint16_t *u_int16_p_local;
  XDR *xdrs_local;
  
  xVar1 = __xdrs[2].x_op;
  if (xVar1 == XDR_ENCODE) {
    xdrs_local._7_1_ = xdr_putuint16((XDR *)__xdrs,(uint)*__up);
    uVar2 = CONCAT71(extraout_var,xdrs_local._7_1_);
  }
  else if (xVar1 == XDR_DECODE) {
    xdrs_local._7_1_ = xdr_getuint16((XDR *)__xdrs,__up);
    uVar2 = CONCAT71(extraout_var_00,xdrs_local._7_1_);
  }
  else {
    uVar2 = (ulong)(xVar1 - XDR_FREE);
    if (xVar1 - XDR_FREE == 0) {
      xdrs_local._7_1_ = true;
    }
    else {
      xdrs_local._7_1_ = false;
    }
  }
  return (bool_t)CONCAT71((int7)(uVar2 >> 8),xdrs_local._7_1_);
}

Assistant:

static inline bool
xdr_uint16_t(XDR *xdrs, uint16_t *u_int16_p)
{
	switch (xdrs->x_op) {

	case XDR_ENCODE:
		return (XDR_PUTUINT16(xdrs, *u_int16_p));

	case XDR_DECODE:
		return (XDR_GETUINT16(xdrs, u_int16_p));

	case XDR_FREE:
		return (true);
	}
	/* NOTREACHED */
	return (false);
}